

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlElementContentPtr
xmlParseElementChildrenContentDeclPriv(xmlParserCtxtPtr ctxt,int inputchk,int depth)

{
  xmlChar xVar1;
  int iVar2;
  xmlElementContentType xVar3;
  _xmlElementContent *p_Var4;
  byte bVar5;
  _xmlElementContent *p_Var6;
  xmlElementContentPtr cur;
  xmlChar *pxVar7;
  xmlParserInputPtr pxVar8;
  byte bVar9;
  long lVar10;
  byte bVar11;
  xmlElementContentPtr pxVar12;
  xmlElementContentPtr cur_00;
  bool bVar13;
  
  if ((0x80 < depth) && ((0x800 < (uint)depth || ((ctxt->options & 0x80000U) == 0)))) {
    xmlFatalErrMsgInt(ctxt,XML_ERR_ELEMCONTENT_NOT_FINISHED,
                      "xmlParseElementChildrenContentDecl : depth %d too deep, use XML_PARSE_HUGE\n"
                      ,depth);
    return (xmlElementContentPtr)0x0;
  }
  xmlSkipBlankChars(ctxt);
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (*ctxt->input->cur == '(') {
    iVar2 = ctxt->input->id;
    xmlNextChar(ctxt);
    xmlSkipBlankChars(ctxt);
    p_Var6 = xmlParseElementChildrenContentDeclPriv(ctxt,iVar2,depth + 1);
    if (p_Var6 == (xmlElementContentPtr)0x0) {
      return (xmlElementContentPtr)0x0;
    }
    xmlSkipBlankChars(ctxt);
    if (ctxt->progressive != 0) goto LAB_0015dd26;
    lVar10 = (long)ctxt->input->end - (long)ctxt->input->cur;
  }
  else {
    pxVar7 = xmlParseName(ctxt);
    if (pxVar7 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_STARTED,(char *)0x0);
      return (xmlElementContentPtr)0x0;
    }
    p_Var6 = xmlNewDocElementContent(ctxt->myDoc,pxVar7,XML_ELEMENT_CONTENT_ELEMENT);
    if (p_Var6 == (xmlElementContentPtr)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      return (xmlElementContentPtr)0x0;
    }
    pxVar8 = ctxt->input;
    if ((ctxt->progressive == 0) && ((long)pxVar8->end - (long)pxVar8->cur < 0xfa)) {
      xmlGROW(ctxt);
      pxVar8 = ctxt->input;
    }
    xVar1 = *pxVar8->cur;
    if (xVar1 == '*') {
      p_Var6->ocur = XML_ELEMENT_CONTENT_MULT;
LAB_0015dcee:
      xmlNextChar(ctxt);
    }
    else {
      if (xVar1 == '+') {
        p_Var6->ocur = XML_ELEMENT_CONTENT_PLUS;
        goto LAB_0015dcee;
      }
      if (xVar1 == '?') {
        p_Var6->ocur = XML_ELEMENT_CONTENT_OPT;
        goto LAB_0015dcee;
      }
      p_Var6->ocur = XML_ELEMENT_CONTENT_ONCE;
    }
    if (ctxt->progressive != 0) goto LAB_0015dd26;
    lVar10 = (long)ctxt->input->end - (long)ctxt->input->cur;
  }
  if (lVar10 < 0xfa) {
    xmlGROW(ctxt);
  }
LAB_0015dd26:
  xmlSkipBlankChars(ctxt);
  pxVar8 = ctxt->input;
  if (((ctxt->progressive == 0) && (500 < (long)pxVar8->cur - (long)pxVar8->base)) &&
     ((long)pxVar8->end - (long)pxVar8->cur < 500)) {
    xmlSHRINK(ctxt);
    pxVar8 = ctxt->input;
  }
  cur_00 = p_Var6;
  if (*pxVar8->cur != 0x29) {
    if (ctxt->instate == XML_PARSER_EOF) {
      cur = (_xmlElementContent *)0x0;
    }
    else {
      cur = (xmlElementContentPtr)0x0;
      pxVar12 = p_Var6;
      bVar5 = *pxVar8->cur;
      bVar9 = 0;
      do {
        bVar11 = bVar5;
        if (bVar11 != 0x7c) {
          if (bVar11 == 0x2c) {
            if ((bVar9 == 0) || (bVar9 == 0x2c)) {
              xmlNextChar(ctxt);
              p_Var6 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_SEQ);
              if (p_Var6 == (xmlElementContentPtr)0x0) {
                if ((cur != (xmlElementContentPtr)0x0) && (cur != cur_00)) {
                  xmlFreeDocElementContent(ctxt->myDoc,cur);
                }
                goto LAB_0015e159;
              }
              goto LAB_0015de15;
            }
            goto LAB_0015e126;
          }
          xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_FINISHED,(char *)0x0);
LAB_0015e13a:
          if ((cur != (xmlElementContentPtr)0x0) && (cur != cur_00)) {
            xmlFreeDocElementContent(ctxt->myDoc,cur);
          }
LAB_0015e150:
          if (cur_00 == (xmlElementContentPtr)0x0) {
            return (xmlElementContentPtr)0x0;
          }
LAB_0015e159:
          xmlFreeDocElementContent(ctxt->myDoc,cur_00);
          return (xmlElementContentPtr)0x0;
        }
        if ((bVar9 != 0) && (bVar9 != 0x7c)) {
LAB_0015e126:
          xmlFatalErrMsgInt(ctxt,XML_ERR_SEPARATOR_REQUIRED,
                            "xmlParseElementChildrenContentDecl : \'%c\' expected\n",(uint)bVar9);
          goto LAB_0015e13a;
        }
        xmlNextChar(ctxt);
        p_Var6 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_OR);
        if (p_Var6 == (xmlElementContentPtr)0x0) goto LAB_0015e13a;
LAB_0015de15:
        if (cur == (xmlElementContentPtr)0x0) {
          p_Var6->c1 = cur_00;
          bVar13 = cur_00 != (xmlElementContentPtr)0x0;
          cur = cur_00;
          cur_00 = p_Var6;
          if (bVar13) goto LAB_0015de3a;
        }
        else {
          pxVar12->c2 = p_Var6;
          p_Var6->parent = pxVar12;
          p_Var6->c1 = cur;
LAB_0015de3a:
          cur->parent = p_Var6;
        }
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        xmlSkipBlankChars(ctxt);
        pxVar8 = ctxt->input;
        if ((ctxt->progressive == 0) && ((long)pxVar8->end - (long)pxVar8->cur < 0xfa)) {
          xmlGROW(ctxt);
          pxVar8 = ctxt->input;
        }
        if (*pxVar8->cur == '(') {
          iVar2 = pxVar8->id;
          xmlNextChar(ctxt);
          xmlSkipBlankChars(ctxt);
          cur = xmlParseElementChildrenContentDeclPriv(ctxt,iVar2,depth + 1);
          if (cur != (xmlElementContentPtr)0x0) {
            xmlSkipBlankChars(ctxt);
            goto LAB_0015df55;
          }
          goto LAB_0015e150;
        }
        pxVar7 = xmlParseName(ctxt);
        if (pxVar7 == (xmlChar *)0x0) {
          xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_STARTED,(char *)0x0);
          if (cur_00 == (xmlElementContentPtr)0x0) {
            return (xmlElementContentPtr)0x0;
          }
          goto LAB_0015e159;
        }
        cur = xmlNewDocElementContent(ctxt->myDoc,pxVar7,XML_ELEMENT_CONTENT_ELEMENT);
        if (cur == (xmlElementContentPtr)0x0) goto LAB_0015e150;
        xVar1 = *ctxt->input->cur;
        if (xVar1 == '*') {
          cur->ocur = XML_ELEMENT_CONTENT_MULT;
        }
        else if (xVar1 == '+') {
          cur->ocur = XML_ELEMENT_CONTENT_PLUS;
        }
        else {
          if (xVar1 != '?') {
            cur->ocur = XML_ELEMENT_CONTENT_ONCE;
            goto LAB_0015df55;
          }
          cur->ocur = XML_ELEMENT_CONTENT_OPT;
        }
        xmlNextChar(ctxt);
LAB_0015df55:
        xmlSkipBlankChars(ctxt);
        pxVar8 = ctxt->input;
        if ((ctxt->progressive == 0) && ((long)pxVar8->end - (long)pxVar8->cur < 0xfa)) {
          xmlGROW(ctxt);
          pxVar8 = ctxt->input;
        }
        if (*pxVar8->cur == 0x29) goto LAB_0015dfb3;
        pxVar12 = p_Var6;
        bVar5 = *pxVar8->cur;
        bVar9 = bVar11;
      } while (ctxt->instate != XML_PARSER_EOF);
    }
    if (cur != (_xmlElementContent *)0x0) {
LAB_0015dfb3:
      p_Var6->c2 = cur;
      cur->parent = p_Var6;
    }
  }
  if (pxVar8->id != inputchk) {
    xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                   "Element content declaration doesn\'t start and stop in the same entity\n");
  }
  xmlNextChar(ctxt);
  xVar1 = *ctxt->input->cur;
  if (xVar1 == '*') {
    if (cur_00 != (xmlElementContentPtr)0x0) {
      cur_00->ocur = XML_ELEMENT_CONTENT_MULT;
      xVar3 = cur_00->type;
      p_Var6 = cur_00;
      while (xVar3 == XML_ELEMENT_CONTENT_OR) {
        p_Var4 = p_Var6->c1;
        if ((p_Var4 != (_xmlElementContent *)0x0) &&
           ((p_Var4->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
          p_Var4->ocur = XML_ELEMENT_CONTENT_ONCE;
        }
        p_Var6 = p_Var6->c2;
        if (p_Var6 == (_xmlElementContent *)0x0) break;
        if ((p_Var6->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT) {
          p_Var6->ocur = XML_ELEMENT_CONTENT_ONCE;
        }
        xVar3 = p_Var6->type;
      }
    }
  }
  else if (xVar1 == '+') {
    if ((cur_00 != (xmlElementContentPtr)0x0) &&
       (cur_00->ocur = ((cur_00->ocur & ~XML_ELEMENT_CONTENT_ONCE) != XML_ELEMENT_CONTENT_OPT) +
                       XML_ELEMENT_CONTENT_MULT, p_Var6->type == XML_ELEMENT_CONTENT_OR)) {
      bVar13 = false;
      do {
        p_Var4 = p_Var6->c1;
        if ((p_Var4 != (_xmlElementContent *)0x0) &&
           ((p_Var4->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
          p_Var4->ocur = XML_ELEMENT_CONTENT_ONCE;
          bVar13 = true;
        }
        p_Var6 = p_Var6->c2;
        if (p_Var6 == (_xmlElementContent *)0x0) break;
        if ((p_Var6->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT) {
          p_Var6->ocur = XML_ELEMENT_CONTENT_ONCE;
          bVar13 = true;
        }
      } while (p_Var6->type == XML_ELEMENT_CONTENT_OR);
      if (bVar13) {
        cur_00->ocur = XML_ELEMENT_CONTENT_MULT;
      }
    }
  }
  else {
    if (xVar1 != '?') {
      return cur_00;
    }
    if (cur_00 != (xmlElementContentPtr)0x0) {
      cur_00->ocur = (cur_00->ocur - XML_ELEMENT_CONTENT_MULT < 2) + XML_ELEMENT_CONTENT_OPT;
    }
  }
  xmlNextChar(ctxt);
  return cur_00;
}

Assistant:

static xmlElementContentPtr
xmlParseElementChildrenContentDeclPriv(xmlParserCtxtPtr ctxt, int inputchk,
                                       int depth) {
    xmlElementContentPtr ret = NULL, cur = NULL, last = NULL, op = NULL;
    const xmlChar *elem;
    xmlChar type = 0;

    if (((depth > 128) && ((ctxt->options & XML_PARSE_HUGE) == 0)) ||
        (depth >  2048)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_ELEMCONTENT_NOT_FINISHED,
"xmlParseElementChildrenContentDecl : depth %d too deep, use XML_PARSE_HUGE\n",
                          depth);
	return(NULL);
    }
    SKIP_BLANKS;
    GROW;
    if (RAW == '(') {
	int inputid = ctxt->input->id;

        /* Recurse on first child */
	NEXT;
	SKIP_BLANKS;
        cur = ret = xmlParseElementChildrenContentDeclPriv(ctxt, inputid,
                                                           depth + 1);
        if (cur == NULL)
            return(NULL);
	SKIP_BLANKS;
	GROW;
    } else {
	elem = xmlParseName(ctxt);
	if (elem == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED, NULL);
	    return(NULL);
	}
        cur = ret = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
	if (cur == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    return(NULL);
	}
	GROW;
	if (RAW == '?') {
	    cur->ocur = XML_ELEMENT_CONTENT_OPT;
	    NEXT;
	} else if (RAW == '*') {
	    cur->ocur = XML_ELEMENT_CONTENT_MULT;
	    NEXT;
	} else if (RAW == '+') {
	    cur->ocur = XML_ELEMENT_CONTENT_PLUS;
	    NEXT;
	} else {
	    cur->ocur = XML_ELEMENT_CONTENT_ONCE;
	}
	GROW;
    }
    SKIP_BLANKS;
    SHRINK;
    while ((RAW != ')') && (ctxt->instate != XML_PARSER_EOF)) {
        /*
	 * Each loop we parse one separator and one element.
	 */
        if (RAW == ',') {
	    if (type == 0) type = CUR;

	    /*
	     * Detect "Name | Name , Name" error
	     */
	    else if (type != CUR) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_SEPARATOR_REQUIRED,
		    "xmlParseElementChildrenContentDecl : '%c' expected\n",
		                  type);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    NEXT;

	    op = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_SEQ);
	    if (op == NULL) {
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
	        xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    if (last == NULL) {
		op->c1 = ret;
		if (ret != NULL)
		    ret->parent = op;
		ret = cur = op;
	    } else {
	        cur->c2 = op;
		if (op != NULL)
		    op->parent = cur;
		op->c1 = last;
		if (last != NULL)
		    last->parent = op;
		cur =op;
		last = NULL;
	    }
	} else if (RAW == '|') {
	    if (type == 0) type = CUR;

	    /*
	     * Detect "Name , Name | Name" error
	     */
	    else if (type != CUR) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_SEPARATOR_REQUIRED,
		    "xmlParseElementChildrenContentDecl : '%c' expected\n",
				  type);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    NEXT;

	    op = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_OR);
	    if (op == NULL) {
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    if (last == NULL) {
		op->c1 = ret;
		if (ret != NULL)
		    ret->parent = op;
		ret = cur = op;
	    } else {
	        cur->c2 = op;
		if (op != NULL)
		    op->parent = cur;
		op->c1 = last;
		if (last != NULL)
		    last->parent = op;
		cur =op;
		last = NULL;
	    }
	} else {
	    xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_FINISHED, NULL);
	    if ((last != NULL) && (last != ret))
	        xmlFreeDocElementContent(ctxt->myDoc, last);
	    if (ret != NULL)
		xmlFreeDocElementContent(ctxt->myDoc, ret);
	    return(NULL);
	}
	GROW;
	SKIP_BLANKS;
	GROW;
	if (RAW == '(') {
	    int inputid = ctxt->input->id;
	    /* Recurse on second child */
	    NEXT;
	    SKIP_BLANKS;
	    last = xmlParseElementChildrenContentDeclPriv(ctxt, inputid,
                                                          depth + 1);
            if (last == NULL) {
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
            }
	    SKIP_BLANKS;
	} else {
	    elem = xmlParseName(ctxt);
	    if (elem == NULL) {
		xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED, NULL);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    last = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
	    if (last == NULL) {
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    if (RAW == '?') {
		last->ocur = XML_ELEMENT_CONTENT_OPT;
		NEXT;
	    } else if (RAW == '*') {
		last->ocur = XML_ELEMENT_CONTENT_MULT;
		NEXT;
	    } else if (RAW == '+') {
		last->ocur = XML_ELEMENT_CONTENT_PLUS;
		NEXT;
	    } else {
		last->ocur = XML_ELEMENT_CONTENT_ONCE;
	    }
	}
	SKIP_BLANKS;
	GROW;
    }
    if ((cur != NULL) && (last != NULL)) {
        cur->c2 = last;
	if (last != NULL)
	    last->parent = cur;
    }
    if (ctxt->input->id != inputchk) {
	xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                       "Element content declaration doesn't start and stop in"
                       " the same entity\n");
    }
    NEXT;
    if (RAW == '?') {
	if (ret != NULL) {
	    if ((ret->ocur == XML_ELEMENT_CONTENT_PLUS) ||
	        (ret->ocur == XML_ELEMENT_CONTENT_MULT))
	        ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    else
	        ret->ocur = XML_ELEMENT_CONTENT_OPT;
	}
	NEXT;
    } else if (RAW == '*') {
	if (ret != NULL) {
	    ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    cur = ret;
	    /*
	     * Some normalization:
	     * (a | b* | c?)* == (a | b | c)*
	     */
	    while ((cur != NULL) && (cur->type == XML_ELEMENT_CONTENT_OR)) {
		if ((cur->c1 != NULL) &&
	            ((cur->c1->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c1->ocur == XML_ELEMENT_CONTENT_MULT)))
		    cur->c1->ocur = XML_ELEMENT_CONTENT_ONCE;
		if ((cur->c2 != NULL) &&
	            ((cur->c2->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c2->ocur == XML_ELEMENT_CONTENT_MULT)))
		    cur->c2->ocur = XML_ELEMENT_CONTENT_ONCE;
		cur = cur->c2;
	    }
	}
	NEXT;
    } else if (RAW == '+') {
	if (ret != NULL) {
	    int found = 0;

	    if ((ret->ocur == XML_ELEMENT_CONTENT_OPT) ||
	        (ret->ocur == XML_ELEMENT_CONTENT_MULT))
	        ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    else
	        ret->ocur = XML_ELEMENT_CONTENT_PLUS;
	    /*
	     * Some normalization:
	     * (a | b*)+ == (a | b)*
	     * (a | b?)+ == (a | b)*
	     */
	    while ((cur != NULL) && (cur->type == XML_ELEMENT_CONTENT_OR)) {
		if ((cur->c1 != NULL) &&
	            ((cur->c1->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c1->ocur == XML_ELEMENT_CONTENT_MULT))) {
		    cur->c1->ocur = XML_ELEMENT_CONTENT_ONCE;
		    found = 1;
		}
		if ((cur->c2 != NULL) &&
	            ((cur->c2->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c2->ocur == XML_ELEMENT_CONTENT_MULT))) {
		    cur->c2->ocur = XML_ELEMENT_CONTENT_ONCE;
		    found = 1;
		}
		cur = cur->c2;
	    }
	    if (found)
		ret->ocur = XML_ELEMENT_CONTENT_MULT;
	}
	NEXT;
    }
    return(ret);
}